

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3AuthReadCol(Parse *pParse,char *zTab,char *zCol,int iDb)

{
  sqlite3 *psVar1;
  char *pcVar2;
  char *local_50;
  char *z;
  int rc;
  char *zDb;
  sqlite3 *db;
  int iDb_local;
  char *zCol_local;
  char *zTab_local;
  Parse *pParse_local;
  
  psVar1 = pParse->db;
  pcVar2 = psVar1->aDb[iDb].zDbSName;
  if ((psVar1->init).busy == '\0') {
    pParse_local._4_4_ =
         (*psVar1->xAuth)(psVar1->pAuthArg,0x14,zTab,zCol,pcVar2,pParse->zAuthContext);
    if (pParse_local._4_4_ == 1) {
      local_50 = sqlite3_mprintf("%s.%s",zTab,zCol);
      if ((2 < psVar1->nDb) || (iDb != 0)) {
        local_50 = sqlite3_mprintf("%s.%z",pcVar2,local_50);
      }
      sqlite3ErrorMsg(pParse,"access to %z is prohibited",local_50);
      pParse->rc = 0x17;
    }
    else if ((pParse_local._4_4_ != 2) && (pParse_local._4_4_ != 0)) {
      sqliteAuthBadReturnCode(pParse);
    }
  }
  else {
    pParse_local._4_4_ = 0;
  }
  return pParse_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3AuthReadCol(
  Parse *pParse,                  /* The parser context */
  const char *zTab,               /* Table name */
  const char *zCol,               /* Column name */
  int iDb                         /* Index of containing database. */
){
  sqlite3 *db = pParse->db;          /* Database handle */
  char *zDb = db->aDb[iDb].zDbSName; /* Schema name of attached database */
  int rc;                            /* Auth callback return code */

  if( db->init.busy ) return SQLITE_OK;
  rc = db->xAuth(db->pAuthArg, SQLITE_READ, zTab,zCol,zDb,pParse->zAuthContext
#ifdef SQLITE_USER_AUTHENTICATION
                 ,db->auth.zAuthUser
#endif
                );
  if( rc==SQLITE_DENY ){
    char *z = sqlite3_mprintf("%s.%s", zTab, zCol);
    if( db->nDb>2 || iDb!=0 ) z = sqlite3_mprintf("%s.%z", zDb, z);
    sqlite3ErrorMsg(pParse, "access to %z is prohibited", z);
    pParse->rc = SQLITE_AUTH;
  }else if( rc!=SQLITE_IGNORE && rc!=SQLITE_OK ){
    sqliteAuthBadReturnCode(pParse);
  }
  return rc;
}